

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::registerAward(Map *this,char type,int duration)

{
  int iVar1;
  ulong uVar2;
  Award *pAVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = 0;
  bVar5 = false;
  while ((this->award[uVar2] == (Award *)0x0 || (this->award[uVar2]->type != type))) {
    bVar5 = 0x12 < uVar2;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x14) {
LAB_001047b9:
      lVar4 = 0;
      do {
        if (this->award[lVar4] == (Award *)0x0) {
          pAVar3 = (Award *)malloc(0xc);
          this->award[lVar4] = pAVar3;
          iVar1 = SDL_GetTicks();
          pAVar3 = this->award[lVar4];
          pAVar3->activationTime = iVar1;
          pAVar3->type = type;
          pAVar3->duration = duration;
          return;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x14);
      return;
    }
  }
  if (!bVar5) {
    return;
  }
  goto LAB_001047b9;
}

Assistant:

void Map::registerAward(char type, int duration){
    for(int i=0; i< MAX_AWARDS; i++){
        if(award[i] && award[i]->type == type){
            return;
        }
    }
    for(int i=0; i< MAX_AWARDS; i++){
        if(!award[i]){
            award[i] = (Award *)malloc(sizeof(Award));
            award[i]->activationTime = SDL_GetTicks();
            award[i]->type = type;
            award[i]->duration = duration;
            break;
        }
    }
}